

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O3

int32 gauden_dist_precompute(gauden_t *g,float32 varfloor)

{
  vector_t pfVar1;
  int iVar2;
  float32 ***pppfVar3;
  int iVar4;
  uint uVar5;
  float *pfVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  double dVar10;
  long local_50;
  long local_48;
  
  pppfVar3 = (float32 ***)
             __ckd_calloc_3d__((long)g->n_mgau,(long)g->n_feat,(long)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                               ,0x157);
  g->det = pppfVar3;
  iVar2 = g->n_mgau;
  if (iVar2 < 1) {
    uVar5 = 0;
  }
  else {
    iVar4 = g->n_feat;
    local_50 = 0;
    uVar5 = 0;
    do {
      if (0 < iVar4) {
        iVar2 = g->n_density;
        local_48 = 0;
        do {
          if (0 < iVar2) {
            iVar4 = g->featlen[local_48];
            pfVar6 = (float *)g->det[local_50][local_48];
            lVar7 = 0;
            do {
              *pfVar6 = 0.0;
              if (iVar4 < 1) {
                fVar9 = 0.0;
              }
              else {
                pfVar1 = g->var[local_50][local_48][lVar7];
                lVar8 = 0;
                do {
                  fVar9 = (float)pfVar1[lVar8];
                  if ((float)pfVar1[lVar8] < (float)varfloor) {
                    pfVar1[lVar8] = varfloor;
                    uVar5 = uVar5 + 1;
                    fVar9 = (float)varfloor;
                  }
                  dVar10 = log((double)fVar9);
                  *pfVar6 = (float)dVar10 + *pfVar6;
                  pfVar1[lVar8] = (float32)(1.0 / ((float)pfVar1[lVar8] + (float)pfVar1[lVar8]));
                  lVar8 = lVar8 + 1;
                } while (iVar4 != (int)lVar8);
                fVar9 = *pfVar6;
                iVar2 = g->n_density;
              }
              *pfVar6 = (fVar9 + (float)iVar4 * 1.837877) * 0.5;
              lVar7 = lVar7 + 1;
              pfVar6 = pfVar6 + 1;
            } while (lVar7 < iVar2);
            iVar4 = g->n_feat;
          }
          local_48 = local_48 + 1;
        } while (local_48 < iVar4);
        iVar2 = g->n_mgau;
      }
      local_50 = local_50 + 1;
    } while (local_50 < iVar2);
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
          ,0x17f,"%d variance values floored\n",(ulong)uVar5);
  return 0;
}

Assistant:

int32
gauden_dist_precompute(gauden_t * g, float32 varfloor)
{
    int32 i, m, f, d, flen;
    float32 *varp, *detp;
    int32 n;

    n = 0;
    /* Allocate space for determinants */
    g->det =
        (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
                                    sizeof(float32));

    /** FIX ME!, There is no removal of Gaussian in ms_mgau. This is
	not yet synchronized with cont_mgau's behavior. */

    for (m = 0; m < g->n_mgau; m++) {
        for (f = 0; f < g->n_feat; f++) {
            flen = g->featlen[f];

            /* Determinants for all variance vectors in g->[m][f] */
            for (d = 0, detp = g->det[m][f]; d < g->n_density; d++, detp++) {
                *detp = (float32) 0.0;

                for (i = 0, varp = g->var[m][f][d]; i < flen; i++, varp++) {
                    if (*varp < varfloor) {
#if 0
                        E_INFO
                            ("varp %f , floor %f n=%d, m %d, f %d c %d, i %d\n",
                             *varp, varfloor, n, m, f, d, i);
#endif
                        *varp = varfloor;
                        n++;
                    }

                    *detp += (float32) (log(*varp));

                    /* Precompute this part of the exponential */
                    *varp = (float32) (1.0 / (*varp * 2.0));
                }

                /* 2pi */
                *detp += (float32) (flen * log(2.0 * M_PI));

                /* Sqrt */
                *detp *= (float32) 0.5;
            }
        }
    }

    if (1)
        E_INFO("%d variance values floored\n", n);

    return 0;
}